

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

bool __thiscall HEkk::debugOneNonbasicMoveVsWorkArraysOk(HEkk *this,HighsInt var)

{
  char cVar1;
  HighsOptions *pHVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  
  if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[var] == '\0') {
    return true;
  }
  pHVar2 = this->options_;
  bVar3 = highs_isInfinity(-(this->info_).workLower_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[var]);
  bVar4 = highs_isInfinity((this->info_).workUpper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[var]);
  if (bVar3) {
    cVar1 = (this->basis_).nonbasicMove_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[var];
    uVar7 = (ulong)(uint)(int)cVar1;
    if (bVar4) {
      if (cVar1 != '\0') {
        uVar6 = (ulong)(uint)(this->lp_).num_col_;
        uVar9 = SUB84((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[var],0);
        dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        dVar12 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        pcVar5 = 
        "Free variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be zero but is  %d\n"
        ;
LAB_0034e6fa:
        highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,pcVar5,uVar9,dVar11,
                    dVar12,(ulong)(uint)var,uVar6,uVar7);
        return false;
      }
      dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      uVar9 = SUB84(dVar11,0);
      uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
      dVar12 = 0.0;
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                    "Free variable %d (lp.num_col_ = %d) so work value should be zero but is %g\n",
                    (ulong)(uint)var,(ulong)(uint)(this->lp_).num_col_);
        return false;
      }
    }
    else {
      if (cVar1 != -1) {
        uVar6 = (ulong)(uint)(this->lp_).num_col_;
        uVar9 = SUB84((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[var],0);
        dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        dVar12 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        pcVar5 = 
        "Finite upper bound and infinite lower bound variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be down but is  %d\n"
        ;
        goto LAB_0034e6fa;
      }
      dVar12 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      dVar11 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      uVar9 = SUB84(dVar11,0);
      uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
      if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
        uVar6 = (ulong)(uint)(this->lp_).num_col_;
        pcVar5 = 
        "Finite upper bound and infinite lower bound variable %d (lp.num_col_ = %d) so work value should be %g but is %g\n"
        ;
        goto LAB_0034e8c4;
      }
    }
  }
  else {
    if (!bVar4) {
      dVar11 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      uVar9 = SUB84(dVar11,0);
      dVar12 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      cVar1 = (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[var];
      uVar7 = (ulong)(uint)(int)cVar1;
      if ((dVar11 != dVar12) || (NAN(dVar11) || NAN(dVar12))) {
        if (cVar1 != '\x01') {
          if (cVar1 != -1) {
            highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                        "Boxed variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] range %g so nonbasic move should be up/down but is  %d\n"
                        ,uVar9,(this->info_).workValue_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[var],dVar12,dVar12 - dVar11,
                        (ulong)(uint)var,(ulong)(uint)(this->lp_).num_col_);
            return false;
          }
          dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[var];
          if ((dVar11 != dVar12) || (NAN(dVar11) || NAN(dVar12))) {
            uVar6 = (ulong)(uint)(this->lp_).num_col_;
            pcVar5 = 
            "Boxed variable %d (lp.num_col_ = %d) with kNonbasicMoveDn so work value should be %g but is %g\n"
            ;
            uVar9 = SUB84(dVar12,0);
LAB_0034e8c4:
            highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,pcVar5,uVar9,
                        (ulong)(uint)var,uVar6);
            return false;
          }
          bVar8 = -(dVar12 == dVar11);
          goto LAB_0034e830;
        }
        dVar12 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
          uVar6 = (ulong)(uint)(this->lp_).num_col_;
          pcVar5 = 
          "Boxed variable %d (lp.num_col_ = %d) with kNonbasicMoveUp so work value should be %g but is %g\n"
          ;
          goto LAB_0034e8c4;
        }
      }
      else {
        if (cVar1 != '\0') {
          uVar6 = (ulong)(uint)(this->lp_).num_col_;
          dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[var];
          pcVar5 = 
          "Fixed variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be zero but is %d\n"
          ;
          goto LAB_0034e6fa;
        }
        dVar12 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[var];
        if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
          uVar6 = (ulong)(uint)(this->lp_).num_col_;
          pcVar5 = 
          "Fixed variable %d (lp.num_col_ = %d) so info.work value should be %g but is %g\n";
          goto LAB_0034e8c4;
        }
      }
      bVar8 = -(dVar11 == dVar12);
      goto LAB_0034e830;
    }
    if ((this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start[var] != '\x01') {
      uVar6 = (ulong)(uint)(this->lp_).num_col_;
      uVar9 = SUB84((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[var],0);
      dVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      dVar12 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[var];
      pcVar5 = 
      "Finite lower bound and infinite upper bound variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be up=%2d but is  %d\n"
      ;
      uVar7 = 1;
      goto LAB_0034e6fa;
    }
    dVar12 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[var];
    dVar11 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[var];
    uVar9 = SUB84(dVar11,0);
    uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
    if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
      uVar6 = (ulong)(uint)(this->lp_).num_col_;
      pcVar5 = 
      "Finite lower bound and infinite upper bound variable %d (lp.num_col_ = %d) so work value should be %g but is %g\n"
      ;
      goto LAB_0034e8c4;
    }
  }
  bVar8 = -(dVar12 == (double)CONCAT44(uVar10,uVar9));
LAB_0034e830:
  return (bool)(bVar8 & 1);
}

Assistant:

bool HEkk::debugOneNonbasicMoveVsWorkArraysOk(const HighsInt var) const {
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  const HighsOptions& options = *(this->options_);
  assert(var >= 0);
  assert(var < lp.num_col_ + lp.num_row_);
  // Make sure we're not checking a basic variable
  if (!basis.nonbasicFlag_[var]) return true;
  bool ok;
  if (!highs_isInfinity(-info.workLower_[var])) {
    if (!highs_isInfinity(info.workUpper_[var])) {
      // Finite lower and upper bounds so nonbasic move depends on whether they
      // are equal
      if (info.workLower_[var] == info.workUpper_[var]) {
        // Fixed variable
        ok = basis.nonbasicMove_[var] == kNonbasicMoveZe;
        if (!ok) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Fixed variable %" HIGHSINT_FORMAT
                      " (lp.num_col_ = %" HIGHSINT_FORMAT
                      ") [%11g, %11g, "
                      "%11g] so nonbasic "
                      "move should be zero but is %" HIGHSINT_FORMAT "\n",
                      var, lp.num_col_, info.workLower_[var],
                      info.workValue_[var], info.workUpper_[var],
                      basis.nonbasicMove_[var]);
          return ok;
        }
        ok = info.workValue_[var] == info.workLower_[var];
        if (!ok) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Fixed variable %" HIGHSINT_FORMAT
                      " (lp.num_col_ = %" HIGHSINT_FORMAT
                      ") so "
                      "info.work value should be %g but "
                      "is %g\n",
                      var, lp.num_col_, info.workLower_[var],
                      info.workValue_[var]);
          return ok;
        }
      } else {
        // Boxed variable
        ok = (basis.nonbasicMove_[var] == kNonbasicMoveUp) ||
             (basis.nonbasicMove_[var] == kNonbasicMoveDn);
        if (!ok) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Boxed variable %" HIGHSINT_FORMAT
              " (lp.num_col_ = %" HIGHSINT_FORMAT
              ") [%11g, %11g, "
              "%11g] range %g so "
              "nonbasic move should be up/down but is  %" HIGHSINT_FORMAT "\n",
              var, lp.num_col_, info.workLower_[var], info.workValue_[var],
              info.workUpper_[var], info.workUpper_[var] - info.workLower_[var],
              basis.nonbasicMove_[var]);
          return ok;
        }
        if (basis.nonbasicMove_[var] == kNonbasicMoveUp) {
          ok = info.workValue_[var] == info.workLower_[var];
          if (!ok) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Boxed variable %" HIGHSINT_FORMAT
                        " (lp.num_col_ = %" HIGHSINT_FORMAT
                        ") with "
                        "kNonbasicMoveUp so work "
                        "value should be %g but is %g\n",
                        var, lp.num_col_, info.workLower_[var],
                        info.workValue_[var]);
            return ok;
          }
        } else {
          ok = info.workValue_[var] == info.workUpper_[var];
          if (!ok) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Boxed variable %" HIGHSINT_FORMAT
                        " (lp.num_col_ = %" HIGHSINT_FORMAT
                        ") with "
                        "kNonbasicMoveDn so work "
                        "value should be %g but is %g\n",
                        var, lp.num_col_, info.workUpper_[var],
                        info.workValue_[var]);
            return ok;
          }
        }
      }
    } else {
      // Infinite upper bound
      ok = basis.nonbasicMove_[var] == kNonbasicMoveUp;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Finite lower bound and infinite upper bound variable "
                    "%" HIGHSINT_FORMAT
                    " "
                    "(lp.num_col_ = "
                    "%" HIGHSINT_FORMAT
                    ") [%11g, %11g, %11g] so nonbasic move should be "
                    "up=%2" HIGHSINT_FORMAT
                    " but is  "
                    "%" HIGHSINT_FORMAT "\n",
                    var, lp.num_col_, info.workLower_[var],
                    info.workValue_[var], info.workUpper_[var], kNonbasicMoveUp,
                    basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == info.workLower_[var];
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite lower bound and infinite upper bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT ") so work value should be %g but is %g\n",
            var, lp.num_col_, info.workLower_[var], info.workValue_[var]);
        return ok;
      }
    }
  } else {
    // Infinite lower bound
    if (!highs_isInfinity(info.workUpper_[var])) {
      ok = basis.nonbasicMove_[var] == kNonbasicMoveDn;
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite upper bound and infinite lower bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT
            ") [%11g, %11g, %11g] so nonbasic move should be down but is  "
            "%" HIGHSINT_FORMAT "\n",
            var, lp.num_col_, info.workLower_[var], info.workValue_[var],
            info.workUpper_[var], basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == info.workUpper_[var];
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite upper bound and infinite lower bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT ") so work value should be %g but is %g\n",
            var, lp.num_col_, info.workUpper_[var], info.workValue_[var]);
        return ok;
      }
    } else {
      // Infinite upper bound
      ok = basis.nonbasicMove_[var] == kNonbasicMoveZe;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Free variable %" HIGHSINT_FORMAT
                    " (lp.num_col_ = %" HIGHSINT_FORMAT
                    ") [%11g, %11g, %11g] "
                    "so nonbasic "
                    "move should be zero but is  %" HIGHSINT_FORMAT "\n",
                    var, lp.num_col_, info.workLower_[var],
                    info.workValue_[var], info.workUpper_[var],
                    basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == 0.0;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Free variable %" HIGHSINT_FORMAT
                    " (lp.num_col_ = %" HIGHSINT_FORMAT
                    ") so work value should "
                    "be zero but "
                    "is %g\n",
                    var, lp.num_col_, info.workValue_[var]);
        return ok;
      }
    }
  }
  // ok must be true if we reach here
  assert(ok);
  return ok;
}